

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O3

double S2::GetArea(S2Shape *shape)

{
  int iVar1;
  int chain_id;
  double dVar2;
  S2PointLoopSpan loop;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  double local_68;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_58;
  S2LogMessage local_38;
  
  iVar1 = (*shape->_vptr_S2Shape[4])();
  dVar2 = 0.0;
  if (iVar1 == 2) {
    local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = (*shape->_vptr_S2Shape[6])(shape);
    if (iVar1 < 1) {
      local_68 = 0.0;
    }
    else {
      local_68 = 0.0;
      chain_id = 0;
      do {
        GetChainVertices(shape,chain_id,&local_58);
        loop.super_S2PointSpan.len_ =
             ((long)local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        loop.super_S2PointSpan.ptr_ =
             local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
             .super__Vector_impl_data._M_start;
        dVar2 = GetSignedArea(loop);
        local_68 = local_68 + dVar2;
        chain_id = chain_id + 1;
      } while (iVar1 != chain_id);
    }
    if (12.566370614359172 < ABS(local_68)) {
      S2LogMessage::S2LogMessage
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_measures.cc"
                 ,0x4e,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_38.stream_,"Check failed: (fabs(area)) <= (4 * 3.14159265358979323846) ",0x3b
                );
      abort();
    }
    dVar2 = (double)(~-(ulong)(local_68 < 0.0) & (ulong)local_68 |
                    (ulong)(local_68 + 12.566370614359172) & -(ulong)(local_68 < 0.0));
    if (local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  return dVar2;
}

Assistant:

double GetArea(const S2Shape& shape) {
  if (shape.dimension() != 2) return 0.0;

  // Since S2Shape uses the convention that the interior of the shape is to
  // the left of all edges, in theory we could compute the area of the polygon
  // by simply adding up all the loop areas modulo 4*Pi.  The problem with
  // this approach is that polygons holes typically have areas near 4*Pi,
  // which can create large cancellation errors when computing the area of
  // small polygons with holes.  For example, a shell with an area of 4 square
  // meters (1e-13 steradians) surrounding a hole with an area of 3 square
  // meters (7.5e-14 sterians) would lose almost all of its accuracy if the
  // area of the hole was computed as 12.566370614359098.
  //
  // So instead we use S2::GetSignedArea() to ensure that all loops have areas
  // in the range [-2*Pi, 2*Pi].
  double area = 0;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    area += S2::GetSignedArea(S2PointLoopSpan(vertices));
  }
  // Note that S2::GetSignedArea() guarantees that the full loop (containing
  // all points on the sphere) has a very small negative area.
  S2_DCHECK_LE(fabs(area), 4 * M_PI);
  if (area < 0.0) area += 4 * M_PI;
  return area;
}